

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

void flecs::_::component_copy<Rocket>
               (ecs_world_t *world,ecs_entity_t component,ecs_entity_t *dst_entity,
               ecs_entity_t *src_entity,void *dst_ptr,void *src_ptr,size_t size,int32_t count,
               void *ctx)

{
  int local_4c;
  int i;
  Rocket *t_src_ptr;
  Rocket *t_dst_ptr;
  void *src_ptr_local;
  void *dst_ptr_local;
  ecs_entity_t *src_entity_local;
  ecs_entity_t *dst_entity_local;
  ecs_entity_t component_local;
  ecs_world_t *world_local;
  
  _ecs_assert(size == 1,0xc,(char *)0x0,"size == sizeof(T)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xcfe);
  if (size == 1) {
    for (local_4c = 0; local_4c < count; local_4c = local_4c + 1) {
    }
    return;
  }
  __assert_fail("size == sizeof(T)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xcfe,
                "void flecs::_::component_copy(ecs_world_t *, ecs_entity_t, const ecs_entity_t *, const ecs_entity_t *, void *, const void *, size_t, int32_t, void *) [T = Rocket]"
               );
}

Assistant:

void component_copy(
    ecs_world_t *world,
    ecs_entity_t component,    
    const ecs_entity_t *dst_entity,
    const ecs_entity_t *src_entity,
    void *dst_ptr,
    const void *src_ptr,
    size_t size,
    int32_t count,
    void *ctx)
{
    (void)world;
    (void)component;
    (void)dst_entity;
    (void)src_entity;
    (void)size;
    (void)ctx;

    ecs_assert(size == sizeof(T), ECS_INTERNAL_ERROR, NULL);
    T *t_dst_ptr = static_cast<T*>(dst_ptr);
    const T *t_src_ptr = static_cast<const T*>(src_ptr);
    
    for (int i = 0; i < count; i ++) {
        t_dst_ptr[i] = t_src_ptr[i];
    }
}